

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

void __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
::populate_initial_block_list
          (ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
           *this,size_t blockCount)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Block *pBVar24;
  bool *pbVar25;
  ulong uVar26;
  size_t sVar27;
  long lVar28;
  int iVar39;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  long lVar40;
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar62;
  undefined1 auVar60 [16];
  int iVar63;
  undefined1 auVar61 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar77;
  int iVar81;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  long lVar43;
  
  this->initialBlockPoolSize = blockCount;
  if (blockCount == 0) {
    this->initialBlockPool = (Block *)0x0;
  }
  else {
    pBVar24 = (Block *)malloc(blockCount * 0x248);
    if (pBVar24 == (Block *)0x0) {
      this->initialBlockPool = (Block *)0x0;
      this->initialBlockPoolSize = 0;
    }
    else {
      pbVar25 = &pBVar24->dynamicallyAllocated;
      sVar27 = blockCount;
      do {
        (((atomic<unsigned_int> *)(pbVar25 + -0x11))->super___atomic_base<unsigned_int>)._M_i = 0;
        (((atomic<duckdb_moodycamel::ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
           *)(pbVar25 + -9))->_M_b)._M_p = (__pointer_type)0x0;
        *(undefined2 *)(pbVar25 + -1) = 0x100;
        *(Block **)(pbVar25 + -0x41) = (Block *)0x0;
        (((atomic<unsigned_long> *)(pbVar25 + -0x39))->super___atomic_base<unsigned_long>)._M_i = 0;
        pbVar25 = pbVar25 + 0x248;
        sVar27 = sVar27 - 1;
      } while (sVar27 != 0);
      this->initialBlockPool = pBVar24;
      auVar23 = _DAT_01d99b10;
      uVar26 = blockCount + 0xf & 0xfffffffffffffff0;
      lVar28 = blockCount - 1;
      auVar29._8_4_ = (int)lVar28;
      auVar29._0_8_ = lVar28;
      auVar29._12_4_ = (int)((ulong)lVar28 >> 0x20);
      pbVar25 = &pBVar24[0xf].dynamicallyAllocated;
      auVar30 = auVar29;
      auVar42 = _DAT_01d9ab70;
      auVar44 = _DAT_01d9ab80;
      auVar45 = _DAT_01d9ab90;
      auVar46 = _DAT_01d9aba0;
      auVar47 = _DAT_01d9abb0;
      auVar48 = _DAT_01d9abc0;
      auVar49 = _DAT_01d9abd0;
      auVar50 = _DAT_01d99b00;
      do {
        auVar60 = auVar29 ^ auVar23;
        auVar64 = auVar50 ^ auVar23;
        iVar39 = auVar60._0_4_;
        iVar77 = -(uint)(iVar39 < auVar64._0_4_);
        iVar41 = auVar60._4_4_;
        auVar66._4_4_ = -(uint)(iVar41 < auVar64._4_4_);
        iVar62 = auVar60._8_4_;
        iVar81 = -(uint)(iVar62 < auVar64._8_4_);
        iVar63 = auVar60._12_4_;
        auVar66._12_4_ = -(uint)(iVar63 < auVar64._12_4_);
        auVar60._4_4_ = iVar77;
        auVar60._0_4_ = iVar77;
        auVar60._8_4_ = iVar81;
        auVar60._12_4_ = iVar81;
        auVar60 = pshuflw(auVar30,auVar60,0xe8);
        auVar65._4_4_ = -(uint)(auVar64._4_4_ == iVar41);
        auVar65._12_4_ = -(uint)(auVar64._12_4_ == iVar63);
        auVar65._0_4_ = auVar65._4_4_;
        auVar65._8_4_ = auVar65._12_4_;
        auVar51 = pshuflw(in_XMM11,auVar65,0xe8);
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar64 = pshuflw(auVar60,auVar66,0xe8);
        auVar30._8_4_ = 0xffffffff;
        auVar30._0_8_ = 0xffffffffffffffff;
        auVar30._12_4_ = 0xffffffff;
        auVar30 = (auVar64 | auVar51 & auVar60) ^ auVar30;
        auVar30 = packssdw(auVar30,auVar30);
        if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar25[-0x2238] = false;
        }
        auVar51._4_4_ = iVar77;
        auVar51._0_4_ = iVar77;
        auVar51._8_4_ = iVar81;
        auVar51._12_4_ = iVar81;
        auVar66 = auVar65 & auVar51 | auVar66;
        auVar30 = packssdw(auVar66,auVar66);
        auVar64._8_4_ = 0xffffffff;
        auVar64._0_8_ = 0xffffffffffffffff;
        auVar64._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30 ^ auVar64,auVar30 ^ auVar64);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._0_4_ >> 8 & 1) != 0) {
          pbVar25[-0x1ff0] = false;
        }
        auVar30 = auVar49 ^ auVar23;
        auVar52._0_4_ = -(uint)(iVar39 < auVar30._0_4_);
        auVar52._4_4_ = -(uint)(iVar41 < auVar30._4_4_);
        auVar52._8_4_ = -(uint)(iVar62 < auVar30._8_4_);
        auVar52._12_4_ = -(uint)(iVar63 < auVar30._12_4_);
        auVar67._4_4_ = auVar52._0_4_;
        auVar67._0_4_ = auVar52._0_4_;
        auVar67._8_4_ = auVar52._8_4_;
        auVar67._12_4_ = auVar52._8_4_;
        iVar77 = -(uint)(auVar30._4_4_ == iVar41);
        iVar81 = -(uint)(auVar30._12_4_ == iVar63);
        auVar10._4_4_ = iVar77;
        auVar10._0_4_ = iVar77;
        auVar10._8_4_ = iVar81;
        auVar10._12_4_ = iVar81;
        auVar78._4_4_ = auVar52._4_4_;
        auVar78._0_4_ = auVar52._4_4_;
        auVar78._8_4_ = auVar52._12_4_;
        auVar78._12_4_ = auVar52._12_4_;
        auVar30 = auVar10 & auVar67 | auVar78;
        auVar30 = packssdw(auVar30,auVar30);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30 ^ auVar1,auVar30 ^ auVar1);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._0_4_ >> 0x10 & 1) != 0) {
          pbVar25[-0x1da8] = false;
        }
        auVar30 = pshufhw(auVar30,auVar67,0x84);
        auVar11._4_4_ = iVar77;
        auVar11._0_4_ = iVar77;
        auVar11._8_4_ = iVar81;
        auVar11._12_4_ = iVar81;
        auVar64 = pshufhw(auVar52,auVar11,0x84);
        auVar60 = pshufhw(auVar30,auVar78,0x84);
        auVar31._8_4_ = 0xffffffff;
        auVar31._0_8_ = 0xffffffffffffffff;
        auVar31._12_4_ = 0xffffffff;
        auVar31 = (auVar60 | auVar64 & auVar30) ^ auVar31;
        auVar30 = packssdw(auVar31,auVar31);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._0_4_ >> 0x18 & 1) != 0) {
          pbVar25[-0x1b60] = false;
        }
        auVar30 = auVar48 ^ auVar23;
        auVar53._0_4_ = -(uint)(iVar39 < auVar30._0_4_);
        auVar53._4_4_ = -(uint)(iVar41 < auVar30._4_4_);
        auVar53._8_4_ = -(uint)(iVar62 < auVar30._8_4_);
        auVar53._12_4_ = -(uint)(iVar63 < auVar30._12_4_);
        auVar12._4_4_ = auVar53._0_4_;
        auVar12._0_4_ = auVar53._0_4_;
        auVar12._8_4_ = auVar53._8_4_;
        auVar12._12_4_ = auVar53._8_4_;
        auVar64 = pshuflw(auVar78,auVar12,0xe8);
        auVar32._0_4_ = -(uint)(auVar30._0_4_ == iVar39);
        auVar32._4_4_ = -(uint)(auVar30._4_4_ == iVar41);
        auVar32._8_4_ = -(uint)(auVar30._8_4_ == iVar62);
        auVar32._12_4_ = -(uint)(auVar30._12_4_ == iVar63);
        auVar68._4_4_ = auVar32._4_4_;
        auVar68._0_4_ = auVar32._4_4_;
        auVar68._8_4_ = auVar32._12_4_;
        auVar68._12_4_ = auVar32._12_4_;
        auVar30 = pshuflw(auVar32,auVar68,0xe8);
        auVar69._4_4_ = auVar53._4_4_;
        auVar69._0_4_ = auVar53._4_4_;
        auVar69._8_4_ = auVar53._12_4_;
        auVar69._12_4_ = auVar53._12_4_;
        auVar60 = pshuflw(auVar53,auVar69,0xe8);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30 & auVar64,(auVar60 | auVar30 & auVar64) ^ auVar2);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar25[-0x1918] = false;
        }
        auVar13._4_4_ = auVar53._0_4_;
        auVar13._0_4_ = auVar53._0_4_;
        auVar13._8_4_ = auVar53._8_4_;
        auVar13._12_4_ = auVar53._8_4_;
        auVar69 = auVar68 & auVar13 | auVar69;
        auVar60 = packssdw(auVar69,auVar69);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30,auVar60 ^ auVar3);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._4_2_ >> 8 & 1) != 0) {
          pbVar25[-0x16d0] = false;
        }
        auVar30 = auVar47 ^ auVar23;
        auVar54._0_4_ = -(uint)(iVar39 < auVar30._0_4_);
        auVar54._4_4_ = -(uint)(iVar41 < auVar30._4_4_);
        auVar54._8_4_ = -(uint)(iVar62 < auVar30._8_4_);
        auVar54._12_4_ = -(uint)(iVar63 < auVar30._12_4_);
        auVar70._4_4_ = auVar54._0_4_;
        auVar70._0_4_ = auVar54._0_4_;
        auVar70._8_4_ = auVar54._8_4_;
        auVar70._12_4_ = auVar54._8_4_;
        iVar77 = -(uint)(auVar30._4_4_ == iVar41);
        iVar81 = -(uint)(auVar30._12_4_ == iVar63);
        auVar14._4_4_ = iVar77;
        auVar14._0_4_ = iVar77;
        auVar14._8_4_ = iVar81;
        auVar14._12_4_ = iVar81;
        auVar79._4_4_ = auVar54._4_4_;
        auVar79._0_4_ = auVar54._4_4_;
        auVar79._8_4_ = auVar54._12_4_;
        auVar79._12_4_ = auVar54._12_4_;
        auVar30 = auVar14 & auVar70 | auVar79;
        auVar30 = packssdw(auVar30,auVar30);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30 ^ auVar4,auVar30 ^ auVar4);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar25[-0x1488] = false;
        }
        auVar30 = pshufhw(auVar30,auVar70,0x84);
        auVar15._4_4_ = iVar77;
        auVar15._0_4_ = iVar77;
        auVar15._8_4_ = iVar81;
        auVar15._12_4_ = iVar81;
        auVar64 = pshufhw(auVar54,auVar15,0x84);
        auVar60 = pshufhw(auVar30,auVar79,0x84);
        auVar33._8_4_ = 0xffffffff;
        auVar33._0_8_ = 0xffffffffffffffff;
        auVar33._12_4_ = 0xffffffff;
        auVar33 = (auVar60 | auVar64 & auVar30) ^ auVar33;
        auVar30 = packssdw(auVar33,auVar33);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._6_2_ >> 8 & 1) != 0) {
          pbVar25[-0x1240] = false;
        }
        auVar30 = auVar46 ^ auVar23;
        auVar55._0_4_ = -(uint)(iVar39 < auVar30._0_4_);
        auVar55._4_4_ = -(uint)(iVar41 < auVar30._4_4_);
        auVar55._8_4_ = -(uint)(iVar62 < auVar30._8_4_);
        auVar55._12_4_ = -(uint)(iVar63 < auVar30._12_4_);
        auVar16._4_4_ = auVar55._0_4_;
        auVar16._0_4_ = auVar55._0_4_;
        auVar16._8_4_ = auVar55._8_4_;
        auVar16._12_4_ = auVar55._8_4_;
        auVar64 = pshuflw(auVar79,auVar16,0xe8);
        auVar34._0_4_ = -(uint)(auVar30._0_4_ == iVar39);
        auVar34._4_4_ = -(uint)(auVar30._4_4_ == iVar41);
        auVar34._8_4_ = -(uint)(auVar30._8_4_ == iVar62);
        auVar34._12_4_ = -(uint)(auVar30._12_4_ == iVar63);
        auVar71._4_4_ = auVar34._4_4_;
        auVar71._0_4_ = auVar34._4_4_;
        auVar71._8_4_ = auVar34._12_4_;
        auVar71._12_4_ = auVar34._12_4_;
        auVar30 = pshuflw(auVar34,auVar71,0xe8);
        auVar72._4_4_ = auVar55._4_4_;
        auVar72._0_4_ = auVar55._4_4_;
        auVar72._8_4_ = auVar55._12_4_;
        auVar72._12_4_ = auVar55._12_4_;
        auVar60 = pshuflw(auVar55,auVar72,0xe8);
        auVar56._8_4_ = 0xffffffff;
        auVar56._0_8_ = 0xffffffffffffffff;
        auVar56._12_4_ = 0xffffffff;
        auVar56 = (auVar60 | auVar30 & auVar64) ^ auVar56;
        auVar60 = packssdw(auVar56,auVar56);
        auVar30 = packsswb(auVar30 & auVar64,auVar60);
        if ((auVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar25[-0xff8] = false;
        }
        auVar17._4_4_ = auVar55._0_4_;
        auVar17._0_4_ = auVar55._0_4_;
        auVar17._8_4_ = auVar55._8_4_;
        auVar17._12_4_ = auVar55._8_4_;
        auVar72 = auVar71 & auVar17 | auVar72;
        auVar60 = packssdw(auVar72,auVar72);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar60 = packssdw(auVar60 ^ auVar5,auVar60 ^ auVar5);
        auVar30 = packsswb(auVar30,auVar60);
        if ((auVar30._8_2_ >> 8 & 1) != 0) {
          pbVar25[-0xdb0] = false;
        }
        auVar30 = auVar45 ^ auVar23;
        auVar57._0_4_ = -(uint)(iVar39 < auVar30._0_4_);
        auVar57._4_4_ = -(uint)(iVar41 < auVar30._4_4_);
        auVar57._8_4_ = -(uint)(iVar62 < auVar30._8_4_);
        auVar57._12_4_ = -(uint)(iVar63 < auVar30._12_4_);
        auVar73._4_4_ = auVar57._0_4_;
        auVar73._0_4_ = auVar57._0_4_;
        auVar73._8_4_ = auVar57._8_4_;
        auVar73._12_4_ = auVar57._8_4_;
        iVar77 = -(uint)(auVar30._4_4_ == iVar41);
        iVar81 = -(uint)(auVar30._12_4_ == iVar63);
        auVar18._4_4_ = iVar77;
        auVar18._0_4_ = iVar77;
        auVar18._8_4_ = iVar81;
        auVar18._12_4_ = iVar81;
        auVar80._4_4_ = auVar57._4_4_;
        auVar80._0_4_ = auVar57._4_4_;
        auVar80._8_4_ = auVar57._12_4_;
        auVar80._12_4_ = auVar57._12_4_;
        auVar30 = auVar18 & auVar73 | auVar80;
        auVar30 = packssdw(auVar30,auVar30);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30 ^ auVar6,auVar30 ^ auVar6);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pbVar25[-0xb68] = false;
        }
        auVar30 = pshufhw(auVar30,auVar73,0x84);
        auVar19._4_4_ = iVar77;
        auVar19._0_4_ = iVar77;
        auVar19._8_4_ = iVar81;
        auVar19._12_4_ = iVar81;
        auVar64 = pshufhw(auVar57,auVar19,0x84);
        auVar60 = pshufhw(auVar30,auVar80,0x84);
        auVar35._8_4_ = 0xffffffff;
        auVar35._0_8_ = 0xffffffffffffffff;
        auVar35._12_4_ = 0xffffffff;
        auVar35 = (auVar60 | auVar64 & auVar30) ^ auVar35;
        auVar30 = packssdw(auVar35,auVar35);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._10_2_ >> 8 & 1) != 0) {
          pbVar25[-0x920] = false;
        }
        auVar30 = auVar44 ^ auVar23;
        auVar58._0_4_ = -(uint)(iVar39 < auVar30._0_4_);
        auVar58._4_4_ = -(uint)(iVar41 < auVar30._4_4_);
        auVar58._8_4_ = -(uint)(iVar62 < auVar30._8_4_);
        auVar58._12_4_ = -(uint)(iVar63 < auVar30._12_4_);
        auVar20._4_4_ = auVar58._0_4_;
        auVar20._0_4_ = auVar58._0_4_;
        auVar20._8_4_ = auVar58._8_4_;
        auVar20._12_4_ = auVar58._8_4_;
        auVar64 = pshuflw(auVar80,auVar20,0xe8);
        auVar36._0_4_ = -(uint)(auVar30._0_4_ == iVar39);
        auVar36._4_4_ = -(uint)(auVar30._4_4_ == iVar41);
        auVar36._8_4_ = -(uint)(auVar30._8_4_ == iVar62);
        auVar36._12_4_ = -(uint)(auVar30._12_4_ == iVar63);
        auVar74._4_4_ = auVar36._4_4_;
        auVar74._0_4_ = auVar36._4_4_;
        auVar74._8_4_ = auVar36._12_4_;
        auVar74._12_4_ = auVar36._12_4_;
        auVar30 = pshuflw(auVar36,auVar74,0xe8);
        auVar75._4_4_ = auVar58._4_4_;
        auVar75._0_4_ = auVar58._4_4_;
        auVar75._8_4_ = auVar58._12_4_;
        auVar75._12_4_ = auVar58._12_4_;
        auVar60 = pshuflw(auVar58,auVar75,0xe8);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30 & auVar64,(auVar60 | auVar30 & auVar64) ^ auVar7);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar25[-0x6d8] = false;
        }
        auVar21._4_4_ = auVar58._0_4_;
        auVar21._0_4_ = auVar58._0_4_;
        auVar21._8_4_ = auVar58._8_4_;
        auVar21._12_4_ = auVar58._8_4_;
        auVar75 = auVar74 & auVar21 | auVar75;
        auVar60 = packssdw(auVar75,auVar75);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30,auVar60 ^ auVar8);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._12_2_ >> 8 & 1) != 0) {
          pbVar25[-0x490] = false;
        }
        auVar30 = auVar42 ^ auVar23;
        auVar59._0_4_ = -(uint)(iVar39 < auVar30._0_4_);
        auVar59._4_4_ = -(uint)(iVar41 < auVar30._4_4_);
        auVar59._8_4_ = -(uint)(iVar62 < auVar30._8_4_);
        auVar59._12_4_ = -(uint)(iVar63 < auVar30._12_4_);
        auVar76._4_4_ = auVar59._0_4_;
        auVar76._0_4_ = auVar59._0_4_;
        auVar76._8_4_ = auVar59._8_4_;
        auVar76._12_4_ = auVar59._8_4_;
        iVar39 = -(uint)(auVar30._4_4_ == iVar41);
        iVar41 = -(uint)(auVar30._12_4_ == iVar63);
        auVar61._4_4_ = iVar39;
        auVar61._0_4_ = iVar39;
        auVar61._8_4_ = iVar41;
        auVar61._12_4_ = iVar41;
        auVar37._4_4_ = auVar59._4_4_;
        auVar37._0_4_ = auVar59._4_4_;
        auVar37._8_4_ = auVar59._12_4_;
        auVar37._12_4_ = auVar59._12_4_;
        auVar37 = auVar61 & auVar76 | auVar37;
        auVar30 = packssdw(auVar37,auVar37);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar30 = packssdw(auVar30 ^ auVar9,auVar30 ^ auVar9);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar25[-0x248] = false;
        }
        auVar30 = pshufhw(auVar30,auVar76,0x84);
        in_XMM11 = pshufhw(auVar59,auVar61,0x84);
        in_XMM11 = in_XMM11 & auVar30;
        auVar22._4_4_ = auVar59._4_4_;
        auVar22._0_4_ = auVar59._4_4_;
        auVar22._8_4_ = auVar59._12_4_;
        auVar22._12_4_ = auVar59._12_4_;
        auVar30 = pshufhw(auVar30,auVar22,0x84);
        auVar38._8_4_ = 0xffffffff;
        auVar38._0_8_ = 0xffffffffffffffff;
        auVar38._12_4_ = 0xffffffff;
        auVar38 = (auVar30 | in_XMM11) ^ auVar38;
        auVar30 = packssdw(auVar38,auVar38);
        auVar30 = packsswb(auVar30,auVar30);
        if ((auVar30._14_2_ >> 8 & 1) != 0) {
          *pbVar25 = false;
        }
        lVar28 = (long)DAT_01e0a400;
        lVar43 = auVar50._8_8_;
        auVar50._0_8_ = auVar50._0_8_ + lVar28;
        lVar40 = DAT_01e0a400._8_8_;
        auVar50._8_8_ = lVar43 + lVar40;
        lVar43 = auVar49._8_8_;
        auVar49._0_8_ = auVar49._0_8_ + lVar28;
        auVar49._8_8_ = lVar43 + lVar40;
        lVar43 = auVar48._8_8_;
        auVar48._0_8_ = auVar48._0_8_ + lVar28;
        auVar48._8_8_ = lVar43 + lVar40;
        lVar43 = auVar47._8_8_;
        auVar47._0_8_ = auVar47._0_8_ + lVar28;
        auVar47._8_8_ = lVar43 + lVar40;
        lVar43 = auVar46._8_8_;
        auVar46._0_8_ = auVar46._0_8_ + lVar28;
        auVar46._8_8_ = lVar43 + lVar40;
        lVar43 = auVar45._8_8_;
        auVar45._0_8_ = auVar45._0_8_ + lVar28;
        auVar45._8_8_ = lVar43 + lVar40;
        lVar43 = auVar44._8_8_;
        auVar44._0_8_ = auVar44._0_8_ + lVar28;
        auVar44._8_8_ = lVar43 + lVar40;
        lVar43 = auVar42._8_8_;
        auVar42._0_8_ = auVar42._0_8_ + lVar28;
        auVar42._8_8_ = lVar43 + lVar40;
        pbVar25 = pbVar25 + 0x2480;
        uVar26 = uVar26 - 0x10;
        auVar30 = _DAT_01e0a400;
      } while (uVar26 != 0);
    }
  }
  return;
}

Assistant:

void populate_initial_block_list(size_t blockCount)
	{
		initialBlockPoolSize = blockCount;
		if (initialBlockPoolSize == 0) {
			initialBlockPool = nullptr;
			return;
		}
		
		initialBlockPool = create_array<Block>(blockCount);
		if (initialBlockPool == nullptr) {
			initialBlockPoolSize = 0;
		}
		for (size_t i = 0; i < initialBlockPoolSize; ++i) {
			initialBlockPool[i].dynamicallyAllocated = false;
		}
	}